

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O2

uint32_t ra_portable_header_size(roaring_array_t *ra)

{
  int iVar1;
  _Bool _Var2;
  uint32_t uVar3;
  
  _Var2 = ra_has_run_container(ra);
  iVar1 = ra->size;
  if (_Var2) {
    if (iVar1 < 4) {
      uVar3 = (int)(iVar1 + 7U) / 8 + iVar1 * 4 + 4;
    }
    else {
      uVar3 = (iVar1 + 7U >> 3) + iVar1 * 8 + 4;
    }
  }
  else {
    uVar3 = iVar1 * 8 + 8;
  }
  return uVar3;
}

Assistant:

uint32_t ra_portable_header_size(const roaring_array_t *ra) {
    if (ra_has_run_container(ra)) {
        if (ra->size <
            NO_OFFSET_THRESHOLD) {  // for small bitmaps, we omit the offsets
            return 4 + (ra->size + 7) / 8 + 4 * ra->size;
        }
        return 4 + (ra->size + 7) / 8 +
               8 * ra->size;  // - 4 because we pack the size with the cookie
    } else {
        return 4 + 4 + 8 * ra->size;
    }
}